

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O3

mz_bool mz_zip_writer_add_from_zip_reader
                  (mz_zip_archive *pZip,mz_zip_archive *pSource_zip,mz_uint src_file_index)

{
  int iVar1;
  mz_zip_internal_state *pArray;
  mz_zip_internal_state *pmVar2;
  size_t sVar3;
  undefined8 uVar4;
  uint uVar5;
  mz_bool mVar6;
  uint uVar7;
  size_t sVar8;
  int *piVar9;
  ulong uVar10;
  ulong uVar11;
  short *psVar12;
  uint uVar13;
  mz_uint8 *pExt;
  ulong uVar14;
  mz_uint64 mVar15;
  void *pvVar16;
  void *pvVar17;
  mz_uint64 mVar18;
  ulong uVar19;
  int *pCentral_dir_header;
  bool bVar20;
  mz_uint64 local_dir_header_ofs;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat src_file_stat;
  mz_uint32 *in_stack_fffffffffffffaa0;
  mz_zip_error local_540;
  ulong local_530;
  uint local_528;
  uint local_524;
  ulong local_520;
  ulong local_518;
  ulong local_510;
  int local_508;
  byte local_502;
  int local_4f6;
  int local_4f2;
  ushort local_4ee;
  ushort local_4ec;
  short *local_4e0;
  mz_zip_array local_4d8;
  undefined6 uStack_4b8;
  undefined4 uStack_4b2;
  undefined4 uStack_4ae;
  mz_zip_array local_4a8;
  mz_zip_archive_file_stat local_488;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pArray = pZip->m_pState;
  if (((((pArray == (mz_zip_internal_state *)0x0) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING)) ||
       (pSource_zip->m_pRead == (mz_file_read_func)0x0)) ||
      ((pmVar2 = pSource_zip->m_pState, pmVar2->m_zip64 != 0 && (pArray->m_zip64 == 0)))) ||
     ((pSource_zip->m_total_files <= src_file_index ||
      (pvVar16 = (pmVar2->m_central_dir).m_p, pvVar16 == (void *)0x0)))) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  pCentral_dir_header =
       (int *)((long)pvVar16 +
              (ulong)*(uint *)((long)(pmVar2->m_central_dir_offsets).m_p + (ulong)src_file_index * 4
                              ));
  if (*pCentral_dir_header != 0x2014b50) {
LAB_0011ff3d:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  local_518 = (ulong)*(ushort *)(pCentral_dir_header + 7);
  local_520 = (ulong)*(ushort *)(pCentral_dir_header + 8);
  local_524 = (uint)*(ushort *)((long)pCentral_dir_header + 0x1e);
  uVar10 = (ulong)((uint)*(ushort *)(pCentral_dir_header + 8) +
                   (uint)*(ushort *)(pCentral_dir_header + 7) + local_524);
  if (((pArray->m_central_dir).m_size + uVar10) - 0xffffffb1 < 0xffffffff00000001)
  goto LAB_0011fcd8;
  if (pZip->m_file_offset_alignment == 0) {
    uVar5 = 0;
  }
  else {
    iVar1 = (int)pZip->m_file_offset_alignment;
    uVar5 = iVar1 - 1;
    uVar5 = iVar1 - ((uint)pZip->m_archive_size & uVar5) & uVar5;
  }
  if (pArray->m_zip64 == 0) {
    if (pZip->m_total_files == 0xffff) {
LAB_0011ff54:
      pZip->m_last_error = MZ_ZIP_TOO_MANY_FILES;
      return 0;
    }
  }
  else if (pZip->m_total_files == 0xffffffff) goto LAB_0011ff54;
  mVar6 = mz_zip_file_stat_internal
                    (pSource_zip,src_file_index,(mz_uint8 *)pCentral_dir_header,&local_488,
                     (mz_bool *)0x0);
  mVar15 = local_488.m_local_header_ofs;
  if (mVar6 == 0) {
    return 0;
  }
  mVar18 = pZip->m_archive_size;
  sVar8 = (*pSource_zip->m_pRead)
                    (pSource_zip->m_pIO_opaque,local_488.m_local_header_ofs,&local_508,0x1e);
  if (sVar8 != 0x1e) goto LAB_001203db;
  if (local_508 != 0x4034b50) goto LAB_0011ff3d;
  uVar14 = (ulong)local_4ec;
  if ((local_4ec == 0) || ((local_4f6 != -1 && (local_4f2 != -1)))) {
    bVar20 = false;
  }
  else {
    local_4d8.m_capacity._0_4_ = 0;
    local_4d8.m_capacity._4_4_ = 0;
    local_4d8._28_2_ = 0;
    local_4d8._30_2_ = 0;
    local_4d8.m_p = (short *)0x0;
    local_4d8.m_size = 0;
    local_4d8.m_element_size = 1;
    mVar6 = mz_zip_array_ensure_capacity(pZip,&local_4d8,uVar14,0);
    if (mVar6 == 0) {
      local_540 = MZ_ZIP_ALLOC_FAILED;
LAB_00120046:
      pZip->m_last_error = local_540;
      return 0;
    }
    local_4e0 = (short *)local_4d8.m_p;
    sVar8 = (*pSource_zip->m_pRead)
                      (pSource_zip->m_pIO_opaque,local_4ee + local_488.m_local_header_ofs + 0x1e,
                       local_4d8.m_p,uVar14);
    local_540 = MZ_ZIP_FILE_READ_FAILED;
    uVar11 = uVar14;
    psVar12 = local_4e0;
    if (sVar8 != uVar14) {
LAB_0012003b:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e0);
      goto LAB_00120046;
    }
    do {
      uVar7 = (uint)uVar11;
      if (uVar7 < 4) {
LAB_00120033:
        local_540 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
        goto LAB_0012003b;
      }
      uVar13 = (ushort)psVar12[1] + 4;
      if (uVar7 < uVar13) goto LAB_00120033;
      bVar20 = *psVar12 == 1;
      if (bVar20) {
        local_540 = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
        if ((ushort)psVar12[1] < 0x10) goto LAB_0012003b;
        break;
      }
      uVar11 = (ulong)(uVar7 - uVar13);
      psVar12 = (short *)((long)psVar12 + (ulong)uVar13);
    } while (uVar7 - uVar13 != 0);
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4e0);
  }
  uVar14 = local_488.m_comp_size + local_4ee + uVar14;
  if ((pArray->m_zip64 == 0) &&
     (0xfffffffe < uVar5 + uVar10 + mVar18 + uVar14 + (pArray->m_central_dir).m_size + 0xb2)) {
    pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
    return 0;
  }
  mVar6 = mz_zip_writer_write_zeros(pZip,mVar18,uVar5);
  if (mVar6 == 0) {
    return 0;
  }
  local_530 = mVar18 + uVar5;
  local_510 = local_530;
  if ((pZip->m_file_offset_alignment != 0) && ((pZip->m_file_offset_alignment - 1 & local_530) != 0)
     ) {
    __assert_fail("(local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyexr/deps/miniz/miniz.c"
                  ,0x1bfe,
                  "mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *, mz_zip_archive *, mz_uint)"
                 );
  }
  sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_530,&local_508,0x1e);
  if (sVar8 != 0x1e) goto LAB_0012059a;
  uVar11 = 0x10000;
  if (uVar14 < 0x10000) {
    uVar11 = uVar14;
  }
  sVar8 = 0x20;
  if (0x20 < uVar11) {
    sVar8 = uVar11;
  }
  piVar9 = (int *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,sVar8);
  if (piVar9 == (int *)0x0) goto LAB_001205f0;
  mVar15 = mVar15 + 0x1e;
  local_530 = local_530 + 0x1e;
  mVar18 = local_530;
  for (; uVar14 != 0; uVar14 = uVar14 - mVar18) {
    mVar18 = 0x10000;
    if (uVar14 < 0x10000) {
      mVar18 = uVar14;
    }
    sVar8 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar15,piVar9,mVar18);
    if (sVar8 != mVar18) goto LAB_001203cf;
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_530,piVar9,mVar18);
    if (sVar8 != mVar18) goto LAB_0012058e;
    mVar15 = mVar15 + mVar18;
    local_530 = local_530 + mVar18;
  }
  local_528 = (uint)mVar18;
  if ((local_502 & 8) != 0) {
    if ((bool)(~bVar20 & pSource_zip->m_pState->m_zip64 == 0)) {
      sVar8 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar15,piVar9,0x10);
      if (sVar8 != 0x10) goto LAB_001203cf;
      if (pZip->m_pState->m_zip64 == 0) {
        local_528 = (uint)(*piVar9 == 0x8074b50) * 4 + 0xc;
      }
      else {
        uVar14 = (ulong)(*piVar9 == 0x8074b50);
        uVar4 = *(undefined8 *)(piVar9 + uVar14);
        *piVar9 = 0x8074b50;
        iVar1 = piVar9[uVar14 + 2];
        *(undefined8 *)(piVar9 + 1) = uVar4;
        piVar9[3] = 0;
        piVar9[4] = iVar1;
        piVar9[5] = 0;
        local_528 = 0x18;
      }
    }
    else {
      sVar8 = (*pSource_zip->m_pRead)(pSource_zip->m_pIO_opaque,mVar15,piVar9,0x18);
      if (sVar8 != 0x18) {
LAB_001203cf:
        (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar9);
LAB_001203db:
        pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
        return 0;
      }
      local_528 = (uint)(*piVar9 == 0x8074b50) * 4 + 0x14;
    }
    uVar14 = (ulong)local_528;
    sVar8 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_530,piVar9,uVar14);
    if (sVar8 != uVar14) {
LAB_0012058e:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar9);
LAB_0012059a:
      pZip->m_last_error = MZ_ZIP_FILE_WRITE_FAILED;
      return 0;
    }
    local_530 = local_530 + uVar14;
  }
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,piVar9);
  uVar14 = (pArray->m_central_dir).m_size;
  local_4d8.m_p = *(void **)pCentral_dir_header;
  local_4d8.m_size = *(size_t *)(pCentral_dir_header + 2);
  uVar4 = *(undefined8 *)(pCentral_dir_header + 6);
  uStack_4b8 = (undefined6)((ulong)*(undefined8 *)((long)pCentral_dir_header + 0x1e) >> 0x10);
  local_4d8.m_capacity._0_4_ = (undefined4)*(undefined8 *)(pCentral_dir_header + 4);
  local_4d8.m_capacity._4_4_ = (undefined4)((ulong)*(undefined8 *)(pCentral_dir_header + 4) >> 0x20)
  ;
  local_4d8.m_element_size = (mz_uint)uVar4;
  local_4d8._28_2_ = SUB82((ulong)uVar4 >> 0x20,0);
  local_4d8._30_2_ = SUB82((ulong)uVar4 >> 0x30,0);
  uStack_4b2 = (undefined4)*(undefined8 *)((long)pCentral_dir_header + 0x26);
  if (pArray->m_zip64 == 0) {
    if ((local_530 >> 0x20 != 0) || (0xfffffffe < local_510)) {
      pZip->m_last_error = MZ_ZIP_ARCHIVE_TOO_LARGE;
      return 0;
    }
    _uStack_4b2 = CONCAT44((int)local_510,uStack_4b2);
    uVar11 = uVar14 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar11) &&
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar11,1), mVar6 == 0))
    goto LAB_001205f0;
    (pArray->m_central_dir).m_size = uVar11;
    uVar11 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(uVar14 * uVar11 + (long)(pArray->m_central_dir).m_p),&local_4d8,uVar11 * 0x2e);
    sVar8 = (pArray->m_central_dir).m_size;
    uVar11 = sVar8 + uVar10;
    if ((uVar11 <= (pArray->m_central_dir).m_capacity) ||
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar11,1), mVar6 != 0)) {
      (pArray->m_central_dir).m_size = uVar11;
      if (uVar10 != 0) {
        uVar11 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(sVar8 * uVar11 + (long)(pArray->m_central_dir).m_p),
               (void *)((long)pCentral_dir_header + 0x2e),uVar10 * uVar11);
LAB_001202aa:
        uVar11 = (pArray->m_central_dir).m_size;
      }
      if (0xfffffffe < uVar11) {
        if ((uVar14 <= (pArray->m_central_dir).m_capacity) ||
           (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,0), mVar6 != 0))
        {
          (pArray->m_central_dir).m_size = uVar14;
        }
LAB_0011fcd8:
        pZip->m_last_error = MZ_ZIP_UNSUPPORTED_CDIR_SIZE;
        return 0;
      }
      local_528 = (uint)uVar14;
      sVar8 = (pArray->m_central_dir_offsets).m_size;
      uVar10 = sVar8 + 1;
      if ((uVar10 <= (pArray->m_central_dir_offsets).m_capacity) ||
         (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir_offsets,uVar10,1),
         mVar6 != 0)) {
        (pArray->m_central_dir_offsets).m_size = uVar10;
        uVar10 = (ulong)(pArray->m_central_dir_offsets).m_element_size;
        memcpy((void *)(sVar8 * uVar10 + (long)(pArray->m_central_dir_offsets).m_p),&local_528,
               uVar10);
        pZip->m_total_files = pZip->m_total_files + 1;
        pZip->m_archive_size = local_530;
        return 1;
      }
    }
  }
  else {
    uVar10 = local_518 & 0xffffffff;
    pExt = (mz_uint8 *)((long)pCentral_dir_header + uVar10 + 0x2e);
    local_4a8.m_capacity = 0;
    local_4a8.m_p = (void *)0x0;
    local_4a8.m_size = 0;
    local_4a8.m_element_size = 1;
    local_4a8._28_4_ = 0;
    local_4d8.m_capacity._4_4_ = 0xffffffff;
    local_4d8.m_element_size = 0xffffffff;
    _uStack_4b2 = CONCAT44(0xffffffff,uStack_4b2);
    mVar6 = mz_zip_writer_update_zip64_extension_block
                      (&local_4a8,pZip,pExt,local_524,&local_488.m_comp_size,
                       &local_488.m_uncomp_size,&local_510,in_stack_fffffffffffffaa0);
    sVar8 = local_4a8.m_size;
    if (mVar6 == 0) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4a8.m_p);
      return 0;
    }
    local_4d8._30_2_ = SUB82(local_4a8.m_size,0);
    sVar3 = (pArray->m_central_dir).m_size;
    uVar11 = sVar3 + 0x2e;
    if (((pArray->m_central_dir).m_capacity < uVar11) &&
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar11,1), mVar6 == 0)) {
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4a8.m_p);
      goto LAB_001205f0;
    }
    (pArray->m_central_dir).m_size = uVar11;
    uVar11 = (ulong)(pArray->m_central_dir).m_element_size;
    memcpy((void *)(sVar3 * uVar11 + (long)(pArray->m_central_dir).m_p),&local_4d8,uVar11 * 0x2e);
    sVar3 = (pArray->m_central_dir).m_size;
    uVar11 = sVar3 + uVar10;
    if (((pArray->m_central_dir).m_capacity < uVar11) &&
       (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar11,1), mVar6 == 0)) {
      pvVar17 = pZip->m_pAlloc_opaque;
      pvVar16 = local_4a8.m_p;
    }
    else {
      (pArray->m_central_dir).m_size = uVar11;
      if ((int)local_518 != 0) {
        uVar11 = (ulong)(pArray->m_central_dir).m_element_size;
        memcpy((void *)(sVar3 * uVar11 + (long)(pArray->m_central_dir).m_p),
               (void *)((long)pCentral_dir_header + 0x2e),uVar10 * uVar11);
        uVar11 = (pArray->m_central_dir).m_size;
      }
      pvVar16 = local_4a8.m_p;
      uVar10 = sVar8 + uVar11;
      if ((uVar10 <= (pArray->m_central_dir).m_capacity) ||
         (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar10,1), mVar6 != 0)) {
        (pArray->m_central_dir).m_size = uVar10;
        if (sVar8 != 0) {
          uVar10 = (ulong)(pArray->m_central_dir).m_element_size;
          memcpy((void *)(uVar11 * uVar10 + (long)(pArray->m_central_dir).m_p),pvVar16,
                 sVar8 * uVar10);
          uVar10 = (pArray->m_central_dir).m_size;
        }
        uVar11 = local_520 & 0xffffffff;
        uVar19 = uVar10 + uVar11;
        if ((uVar19 <= (pArray->m_central_dir).m_capacity) ||
           (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar19,1), mVar6 != 0))
        {
          (pArray->m_central_dir).m_size = uVar19;
          if ((int)local_520 != 0) {
            uVar19 = (ulong)(pArray->m_central_dir).m_element_size;
            memcpy((void *)(uVar10 * uVar19 + (long)(pArray->m_central_dir).m_p),pExt + local_524,
                   uVar11 * uVar19);
          }
          (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pvVar16);
          goto LAB_001202aa;
        }
      }
      pvVar17 = pZip->m_pAlloc_opaque;
    }
    (*pZip->m_pFree)(pvVar17,pvVar16);
  }
  if ((uVar14 <= (pArray->m_central_dir).m_capacity) ||
     (mVar6 = mz_zip_array_ensure_capacity(pZip,&pArray->m_central_dir,uVar14,0), mVar6 != 0)) {
    (pArray->m_central_dir).m_size = uVar14;
  }
LAB_001205f0:
  pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_from_zip_reader(mz_zip_archive *pZip, mz_zip_archive *pSource_zip, mz_uint src_file_index)
{
    mz_uint n, bit_flags, num_alignment_padding_bytes, src_central_dir_following_data_size;
    mz_uint64 src_archive_bytes_remaining, local_dir_header_ofs;
    mz_uint64 cur_src_file_ofs, cur_dst_file_ofs;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint8 new_central_header[MZ_ZIP_CENTRAL_DIR_HEADER_SIZE];
    size_t orig_central_dir_size;
    mz_zip_internal_state *pState;
    void *pBuf;
    const mz_uint8 *pSrc_central_header;
    mz_zip_archive_file_stat src_file_stat;
    mz_uint32 src_filename_len, src_comment_len, src_ext_len;
    mz_uint32 local_header_filename_size, local_header_extra_len;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;

    /* Sanity checks */
    if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pSource_zip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    /* Don't support copying files from zip64 archives to non-zip64, even though in some cases this is possible */
    if ((pSource_zip->m_pState->m_zip64) && (!pZip->m_pState->m_zip64))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    /* Get pointer to the source central dir header and crack it */
    if (NULL == (pSrc_central_header = mz_zip_get_cdh(pSource_zip, src_file_index)))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (MZ_READ_LE32(pSrc_central_header + MZ_ZIP_CDH_SIG_OFS) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    src_filename_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_FILENAME_LEN_OFS);
    src_comment_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_COMMENT_LEN_OFS);
    src_ext_len = MZ_READ_LE16(pSrc_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS);
    src_central_dir_following_data_size = src_filename_len + src_ext_len + src_comment_len;

    /* TODO: We don't support central dir's >= MZ_UINT32_MAX bytes right now (+32 fudge factor in case we need to add more extra data) */
    if ((pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + 32) >= MZ_UINT32_MAX)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);

    num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

    if (!pState->m_zip64)
    {
        if (pZip->m_total_files == MZ_UINT16_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }
    else
    {
        /* TODO: Our zip64 support still has some 32-bit limits that may not be worth fixing. */
        if (pZip->m_total_files == MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_TOO_MANY_FILES);
    }

    if (!mz_zip_file_stat_internal(pSource_zip, src_file_index, pSrc_central_header, &src_file_stat, NULL))
        return MZ_FALSE;

    cur_src_file_ofs = src_file_stat.m_local_header_ofs;
    cur_dst_file_ofs = pZip->m_archive_size;

    /* Read the source archive's local dir header */
    if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_src_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Compute the total size we need to copy (filename+extra data+compressed data) */
    local_header_filename_size = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    src_archive_bytes_remaining = src_file_stat.m_comp_size + local_header_filename_size + local_header_extra_len ;

    /* Try to find a zip64 extended information field */
    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_zip_array file_data_array;
        const mz_uint8 *pExtra_data;
        mz_uint32 extra_size_remaining = local_header_extra_len;

        mz_zip_array_init(&file_data_array, 1);
        if (!mz_zip_array_resize(pZip, &file_data_array, local_header_extra_len, MZ_FALSE))
        {
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, src_file_stat.m_local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_size, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_array_clear(pZip, &file_data_array);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }

        pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
            {
                mz_zip_array_clear(pZip, &file_data_array);
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
            }

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_array_clear(pZip, &file_data_array);
                    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64)); /* may be 0 if there's a descriptor */

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);

        mz_zip_array_clear(pZip, &file_data_array);
    }

    if (!pState->m_zip64)
    {
        /* Try to detect if the new archive will most likely wind up too big and bail early (+(sizeof(mz_uint32) * 4) is for the optional descriptor which could be present, +64 is a fudge factor). */
        /* We also check when the archive is finalized so this doesn't need to be perfect. */
        mz_uint64 approx_new_archive_size = cur_dst_file_ofs + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + src_archive_bytes_remaining + (sizeof(mz_uint32) * 4) +
                                            pState->m_central_dir.m_size + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_central_dir_following_data_size + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE + 64;

        if (approx_new_archive_size >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);
    }

    /* Write dest archive padding */
    if (!mz_zip_writer_write_zeros(pZip, cur_dst_file_ofs, num_alignment_padding_bytes))
        return MZ_FALSE;

    cur_dst_file_ofs += num_alignment_padding_bytes;

    local_dir_header_ofs = cur_dst_file_ofs;
    if (pZip->m_file_offset_alignment)
    {
        MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
    }

    /* The original zip's local header+ext block doesn't change, even with zip64, so we can just copy it over to the dest zip */
    if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);

    cur_dst_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE;

    /* Copy over the source archive bytes to the dest archive, also ensure we have enough buf space to handle optional data descriptor */
    if (NULL == (pBuf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)MZ_MAX(32U, MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining)))))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    while (src_archive_bytes_remaining)
    {
        n = (mz_uint)MZ_MIN((mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE, src_archive_bytes_remaining);
        if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
        }
        cur_src_file_ofs += n;

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }
        cur_dst_file_ofs += n;

        src_archive_bytes_remaining -= n;
    }

    /* Now deal with the optional data descriptor */
    bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    if (bit_flags & 8)
    {
        /* Copy data descriptor */
        if ((pSource_zip->m_pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            /* src is zip64, dest must be zip64 */

            /* name			uint32_t's */
            /* id				1 (optional in zip64?) */
            /* crc			1 */
            /* comp_size	2 */
            /* uncomp_size 2 */
            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, (sizeof(mz_uint32) * 6)) != (sizeof(mz_uint32) * 6))
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            n = sizeof(mz_uint32) * ((MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID) ? 6 : 5);
        }
        else
        {
            /* src is NOT zip64 */
            mz_bool has_id;

            if (pSource_zip->m_pRead(pSource_zip->m_pIO_opaque, cur_src_file_ofs, pBuf, sizeof(mz_uint32) * 4) != sizeof(mz_uint32) * 4)
            {
                pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
                return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            }

            has_id = (MZ_READ_LE32(pBuf) == MZ_ZIP_DATA_DESCRIPTOR_ID);

            if (pZip->m_pState->m_zip64)
            {
                /* dest is zip64, so upgrade the data descriptor */
                const mz_uint8 *pSrc_descriptor = (const mz_uint8 *)pBuf + (has_id ? sizeof(mz_uint32) : 0);
                const mz_uint32 src_crc32 = MZ_READ_LE32(pSrc_descriptor);
                const mz_uint64 src_comp_size = MZ_READ_LE32(pSrc_descriptor + sizeof(mz_uint32));
                const mz_uint64 src_uncomp_size = MZ_READ_LE32(pSrc_descriptor + 2*sizeof(mz_uint32));

                mz_write_le32((mz_uint8 *)pBuf, MZ_ZIP_DATA_DESCRIPTOR_ID);
                mz_write_le32((mz_uint8 *)pBuf + sizeof(mz_uint32) * 1, src_crc32);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 2, src_comp_size);
                mz_write_le64((mz_uint8 *)pBuf + sizeof(mz_uint32) * 4, src_uncomp_size);

                n = sizeof(mz_uint32) * 6;
            }
            else
            {
                /* dest is NOT zip64, just copy it as-is */
                n = sizeof(mz_uint32) * (has_id ? 4 : 3);
            }
        }

        if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_dst_file_ofs, pBuf, n) != n)
        {
            pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_WRITE_FAILED);
        }

        cur_src_file_ofs += n;
        cur_dst_file_ofs += n;
    }
    pZip->m_pFree(pZip->m_pAlloc_opaque, pBuf);

    /* Finally, add the new central dir header */
    orig_central_dir_size = pState->m_central_dir.m_size;

    memcpy(new_central_header, pSrc_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE);

    if (pState->m_zip64)
    {
        /* This is the painful part: We need to write a new central dir header + ext block with updated zip64 fields, and ensure the old fields (if any) are not included. */
        const mz_uint8 *pSrc_ext = pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len;
        mz_zip_array new_ext_block;

        mz_zip_array_init(&new_ext_block, sizeof(mz_uint8));

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS, MZ_UINT32_MAX);
        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, MZ_UINT32_MAX);

        if (!mz_zip_writer_update_zip64_extension_block(&new_ext_block, pZip, pSrc_ext, src_ext_len, &src_file_stat.m_comp_size, &src_file_stat.m_uncomp_size, &local_dir_header_ofs, NULL))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return MZ_FALSE;
        }

        MZ_WRITE_LE16(new_central_header + MZ_ZIP_CDH_EXTRA_LEN_OFS, new_ext_block.m_size);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_filename_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_ext_block.m_p, new_ext_block.m_size))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + src_filename_len + src_ext_len, src_comment_len))
        {
            mz_zip_array_clear(pZip, &new_ext_block);
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }

        mz_zip_array_clear(pZip, &new_ext_block);
    }
    else
    {
        /* sanity checks */
        if (cur_dst_file_ofs > MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        if (local_dir_header_ofs >= MZ_UINT32_MAX)
            return mz_zip_set_error(pZip, MZ_ZIP_ARCHIVE_TOO_LARGE);

        MZ_WRITE_LE32(new_central_header + MZ_ZIP_CDH_LOCAL_HEADER_OFS, local_dir_header_ofs);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, new_central_header, MZ_ZIP_CENTRAL_DIR_HEADER_SIZE))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        if (!mz_zip_array_push_back(pZip, &pState->m_central_dir, pSrc_central_header + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE, src_central_dir_following_data_size))
        {
            mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
        }
    }

    /* This shouldn't trigger unless we screwed up during the initial sanity checks */
    if (pState->m_central_dir.m_size >= MZ_UINT32_MAX)
    {
        /* TODO: Support central dirs >= 32-bits in size */
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_CDIR_SIZE);
    }

    n = (mz_uint32)orig_central_dir_size;
    if (!mz_zip_array_push_back(pZip, &pState->m_central_dir_offsets, &n, 1))
    {
        mz_zip_array_resize(pZip, &pState->m_central_dir, orig_central_dir_size, MZ_FALSE);
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    pZip->m_total_files++;
    pZip->m_archive_size = cur_dst_file_ofs;

    return MZ_TRUE;
}